

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O1

invocation_table<afsm::test::events::do_work> *
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::ortho_sm_def::off,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>
::state_table<afsm::test::events::do_work,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  if (state_table<afsm::test::events::do_work,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)::
      _table == '\0') {
    state_table<afsm::test::events::do_work,0ul,1ul>();
  }
  return &inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
          ::state_table<afsm::test::events::do_work,_0UL,_1UL>::_table;
}

Assistant:

static invocation_table<Event> const&
    state_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static invocation_table<Event> _table {{ process_event_handler<Indexes>{}... }};
        return _table;
    }